

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * __thiscall
vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>::doEvaluate
          (IVal *__return_storage_ptr__,Variable<tcu::Vector<float,_2>_> *this,EvalContext *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  undefined7 uVar5;
  bool bVar6;
  undefined7 uVar7;
  IVal *pIVar8;
  long lVar9;
  
  pIVar8 = Environment::lookup<tcu::Vector<float,2>>(ctx->env,this);
  lVar9 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar9 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar9 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar9) = 0xfff0000000000000;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x40);
  bVar6 = pIVar8->m_data[0].m_hasNaN;
  uVar7 = *(undefined7 *)&pIVar8->m_data[0].field_0x1;
  dVar1 = pIVar8->m_data[0].m_lo;
  dVar2 = pIVar8->m_data[0].m_hi;
  bVar4 = pIVar8->m_data[1].m_hasNaN;
  uVar5 = *(undefined7 *)&pIVar8->m_data[1].field_0x1;
  dVar3 = pIVar8->m_data[1].m_hi;
  __return_storage_ptr__->m_data[1].m_lo = pIVar8->m_data[1].m_lo;
  __return_storage_ptr__->m_data[1].m_hi = dVar3;
  __return_storage_ptr__->m_data[0].m_hi = dVar2;
  __return_storage_ptr__->m_data[1].m_hasNaN = bVar4;
  *(undefined7 *)&__return_storage_ptr__->m_data[1].field_0x1 = uVar5;
  __return_storage_ptr__->m_data[0].m_hasNaN = bVar6;
  *(undefined7 *)&__return_storage_ptr__->m_data[0].field_0x1 = uVar7;
  __return_storage_ptr__->m_data[0].m_lo = dVar1;
  return __return_storage_ptr__;
}

Assistant:

IVal			doEvaluate	(const EvalContext& ctx)		const
	{
		return ctx.env.lookup<T>(*this);
	}